

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

clip_image_size
llava_uhd::get_best_resize
          (clip_image_size *original_size,int scale_resolution,int patch_size,bool allow_upscale)

{
  clip_image_size cVar1;
  int iVar2;
  int iVar3;
  byte in_CL;
  int in_ESI;
  int *in_RDI;
  float r;
  int height;
  int width;
  clip_image_size res;
  int in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  
  if ((in_ESI * in_ESI < *in_RDI * in_RDI[1]) || ((in_CL & 1) != 0)) {
    in_stack_ffffffffffffffd4 = (float)in_ESI;
    std::sqrt((double)(ulong)(uint)((float)*in_RDI / (float)in_RDI[1]));
  }
  iVar2 = ensure_divide((int)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  iVar3 = ensure_divide((int)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  cVar1.height = iVar3;
  cVar1.width = iVar2;
  return cVar1;
}

Assistant:

static clip_image_size get_best_resize(const clip_image_size & original_size, int scale_resolution, int patch_size, bool allow_upscale = false) {
        int width  = original_size.width;
        int height = original_size.height;
        if ((width * height > scale_resolution * scale_resolution) || allow_upscale) {
            float r = static_cast<float>(width) / height;
            height  = static_cast<int>(scale_resolution / std::sqrt(r));
            width   = static_cast<int>(height * r);
        }
        clip_image_size res;
        res.width  = ensure_divide(width,  patch_size);
        res.height = ensure_divide(height, patch_size);
        return res;
    }